

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Publications.cpp
# Opt level: O0

void __thiscall
helics::Publication::publish(Publication *this,vector<double,_std::allocator<double>_> *val)

{
  bool bVar1;
  vector<double,_std::allocator<double>_> *in_RDI;
  SmallBuffer db;
  bool doPublish;
  SmallBuffer *this_00;
  undefined4 in_stack_ffffffffffffff58;
  DataType in_stack_ffffffffffffff5c;
  data_view *in_stack_ffffffffffffff60;
  Publication *in_stack_ffffffffffffff68;
  ValueFederate *in_stack_ffffffffffffff70;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff78;
  variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
  *in_stack_ffffffffffffff80;
  bool local_11;
  
  local_11 = in_RDI[2].super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish != (pointer)0x0;
  if (((ulong)in_RDI[3].super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage & 0x100000000) != 0) {
    bVar1 = changeDetected((defV *)in_stack_ffffffffffffff68,
                           (vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff60,
                           (double)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    if (bVar1) {
      std::
      variant<double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
      ::operator=(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    }
    local_11 = bVar1 && local_11;
  }
  if (local_11) {
    typeConvert(in_stack_ffffffffffffff5c,in_RDI);
    this_00 = (SmallBuffer *)
              in_RDI[2].super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish;
    data_view::data_view
              (in_stack_ffffffffffffff60,
               (SmallBuffer *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    helics::ValueFederate::publishBytes
              (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
    data_view::~data_view((data_view *)0x3acf0f);
    SmallBuffer::~SmallBuffer(this_00);
  }
  return;
}

Assistant:

void Publication::publish(const std::vector<double>& val)
{
    bool doPublish = (fed != nullptr);
    if (changeDetectionEnabled) {
        if (changeDetected(prevValue, val, delta)) {
            prevValue = val;
        } else {
            doPublish = false;
        }
    }
    if (doPublish) {
        auto db = typeConvert(pubType, val);
        fed->publishBytes(*this, db);
    }
}